

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O0

void anon_unknown.dwarf_47f3d::test(void)

{
  ostream *poVar1;
  int k;
  int j;
  int i_1;
  int i;
  float in_stack_00000044;
  V3f *in_stack_000000c0;
  Vec3<float> local_1c;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  random angles");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"    3x3");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  testRandomAngles33();
  poVar1 = std::operator<<((ostream *)&std::cout,"    4x4");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  testRandomAngles44();
  poVar1 = std::operator<<((ostream *)&std::cout,"  special angles");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"    3x3");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_4 = 0; local_4 < 0x168; local_4 = local_4 + 0x5a) {
    testAngles33(in_stack_00000044);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"    4x4");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_8 = 0; local_8 < 0x168; local_8 = local_8 + 0x5a) {
    for (local_c = 0; local_c < 0x168; local_c = local_c + 0x5a) {
      for (local_10 = 0; local_10 < 0x168; local_10 = local_10 + 0x5a) {
        Imath_3_2::Vec3<float>::Vec3(&local_1c,(float)local_8,(float)local_c,(float)local_10);
        testAngles44(in_stack_000000c0);
      }
    }
  }
  return;
}

Assistant:

void
test ()
{
    cout << "  random angles" << endl;

    cout << "    3x3" << endl;
    testRandomAngles33 ();

    cout << "    4x4" << endl;
    testRandomAngles44 ();

    cout << "  special angles" << endl;

    cout << "    3x3" << endl;
    for (int i = 0; i < 360; i += 90)
        testAngles33 (float (i));

    cout << "    4x4" << endl;
    for (int i = 0; i < 360; i += 90)
        for (int j = 0; j < 360; j += 90)
            for (int k = 0; k < 360; k += 90)
                testAngles44 (V3f (float(i), float(j), float(k)));
}